

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

Vec3f __thiscall Model::normal(Model *this,int fi,int li)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  reference pvVar3;
  reference v;
  int in_ECX;
  undefined4 in_register_00000034;
  Model *this_01;
  undefined8 extraout_XMM0_Qa;
  float in_XMM1_Da;
  Vec3f VVar4;
  int li_local;
  int fi_local;
  Model *this_local;
  
  this_01 = (Model *)CONCAT44(in_register_00000034,fi);
  bVar1 = false;
  if (-1 < li) {
    iVar2 = nfaces(this_01);
    bVar1 = false;
    if ((li < iVar2) && (bVar1 = false, -1 < in_ECX)) {
      bVar1 = in_ECX < 3;
    }
  }
  if (!bVar1) {
    __assert_fail("fi>=0 && fi<nfaces() && li>=0 && li<3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/model.cpp"
                  ,0x5c,"Vec3f Model::normal(int, int)");
  }
  this_00 = std::
            vector<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
            ::operator[](&this_01->faces,(long)li);
  pvVar3 = std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>::operator[](this_00,(long)in_ECX);
  v = std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::operator[]
                (&this_01->norms,(long)pvVar3->z);
  Vec3<float>::Vec3((Vec3<float> *)this,v);
  VVar4.z = in_XMM1_Da;
  VVar4.x = (float)(int)extraout_XMM0_Qa;
  VVar4.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar4;
}

Assistant:

Vec3f Model::normal(int fi, int li) {
    assert(fi>=0 && fi<nfaces() && li>=0 && li<3);
    return norms[faces[fi][li].z];
}